

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::php::anon_unknown_2::GenerateEnumFile
          (anon_unknown_2 *this,FileDescriptor *file,EnumDescriptor *en,Options *options,
          GeneratorContext *generator_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Options *options_00;
  bool bVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  ZeroCopyOutputStream *pZVar7;
  long *plVar8;
  int indentCount;
  long lVar9;
  string filename_1;
  Printer printer_1;
  Printer printer;
  string php_namespace;
  string filename;
  string fullname;
  string newname;
  string local_258;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  undefined1 local_200 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [3];
  Printer local_198;
  string local_f8;
  string local_d8;
  ZeroCopyOutputStream *local_b8;
  Options *local_b0;
  FileDescriptor *local_a8;
  string local_a0;
  string local_80;
  anon_unknown_2 *local_60;
  Options *local_58;
  string local_50;
  
  local_b0 = options;
  FullClassName<google::protobuf::EnumDescriptor>
            ((string *)local_238,(EnumDescriptor *)file,(Options *)en);
  if ((ZeroCopyOutputStream *)local_238._8_8_ != (ZeroCopyOutputStream *)0x0) {
    pZVar7 = (ZeroCopyOutputStream *)0x0;
    do {
      if (*(char *)(local_238._0_8_ + (long)pZVar7) == '\\') {
        *(char *)(local_238._0_8_ + (long)pZVar7) = '/';
      }
      pZVar7 = (ZeroCopyOutputStream *)((long)&pZVar7->_vptr_ZeroCopyOutputStream + 1);
    } while (pZVar7 < (ulong)local_238._8_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_238._0_8_,
             (pointer)(local_238._0_8_ + (long)(_func_int ***)local_238._8_8_));
  std::__cxx11::string::append((char *)&local_d8);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  local_b8 = (ZeroCopyOutputStream *)(**(code **)(*(long *)local_b0 + 0x10))(local_b0,&local_d8);
  io::Printer::Printer(&local_198,local_b8,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_198,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this);
  local_60 = this;
  FilenameToClassname(&local_80,&local_d8);
  lVar4 = std::__cxx11::string::find_last_of((char *)&local_80,0x3e4bdf,0xffffffffffffffff);
  if (lVar4 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)local_238,(ulong)&local_80);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_198,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
    io::Printer::Print<>(&local_198,"use UnexpectedValueException;\n\n");
  }
  io::Printer::Print<>(&local_198,"/**\n");
  local_238._16_8_ = &local_218;
  local_238._24_8_ = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_p = local_200 + 8;
  local_200._0_8_ = 0;
  local_200[8] = '\0';
  local_1e8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = EnumDescriptor::GetSourceLocation((EnumDescriptor *)file,(SourceLocation *)local_238);
  if (bVar3) {
    GenerateDocCommentBodyForLocation
              ((anon_unknown_2 *)&local_198,(Printer *)local_238,(SourceLocation *)0x1,false,
               (int)generator_context);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1e8);
  if (local_208._M_p != local_200 + 8) {
    operator_delete(local_208._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._16_8_ != &local_218) {
    operator_delete((void *)local_238._16_8_);
  }
  EscapePhpdoc((string *)local_238,(string *)(*(long *)(file + 8) + 0x20));
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_198," * Protobuf type <code>^fullname^</code>\n */\n",(char (*) [9])"fullname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_);
  }
  if (lVar4 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)local_238,(ulong)&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (&local_198,"class ^name^\n{\n",(char (*) [5])0x3f58c9,&local_80);
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  local_a8 = file;
  local_58 = (Options *)en;
  if (0 < *(int *)(file + 4)) {
    lVar4 = 0;
    lVar9 = 0;
    do {
      indentCount = (int)generator_context;
      lVar2 = *(long *)(file + 0x28);
      io::Printer::Print<>(&local_198,"/**\n");
      local_238._16_8_ = &local_218;
      local_238._24_8_ = 0;
      local_218._M_local_buf[0] = '\0';
      local_208._M_p = local_200 + 8;
      local_200._0_8_ = 0;
      local_200[8] = '\0';
      local_1e8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar3 = EnumValueDescriptor::GetSourceLocation
                        ((EnumValueDescriptor *)(lVar2 + lVar4),(SourceLocation *)local_238);
      if (bVar3) {
        GenerateDocCommentBodyForLocation
                  ((anon_unknown_2 *)&local_198,(Printer *)local_238,(SourceLocation *)0x1,false,
                   indentCount);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_1e8);
      if (local_208._M_p != local_200 + 8) {
        operator_delete(local_208._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._16_8_ != &local_218) {
        operator_delete((void *)local_238._16_8_);
      }
      EnumValueDescriptor::DebugString_abi_cxx11_(&local_f8,(EnumValueDescriptor *)(lVar2 + lVar4));
      FirstLineOf(&local_258,&local_f8);
      EscapePhpdoc((string *)local_238,&local_258);
      io::Printer::Print<char[4],std::__cxx11::string>
                (&local_198," * Generated from protobuf enum <code>^def^</code>\n */\n",
                 (char (*) [4])0x3ebae1,(string *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      ConstantNamePrefix(&local_258,*(string **)(lVar2 + 8 + lVar4));
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_258,**(ulong **)(lVar2 + 8 + lVar4));
      local_238._0_8_ = local_238 + 0x10;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_238._16_8_ = *plVar8;
        local_238._24_8_ = plVar5[3];
      }
      else {
        local_238._16_8_ = *plVar8;
        local_238._0_8_ = (long *)*plVar5;
      }
      local_238._8_8_ = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      (anonymous_namespace)::IntToString_abi_cxx11_
                (&local_f8,(_anonymous_namespace_ *)(ulong)*(uint *)(lVar2 + 4 + lVar4),
                 (int32)local_238._8_8_);
      generator_context = (GeneratorContext *)0x40a31d;
      io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (&local_198,"const ^name^ = ^number^;\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (char (*) [7])0x40a31d,&local_f8);
      file = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      lVar9 = lVar9 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar9 < *(int *)(file + 4));
  }
  io::Printer::Print<>(&local_198,"\nprivate static $valueToName = [\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  if (0 < *(int *)(file + 4)) {
    lVar9 = 8;
    lVar4 = 0;
    do {
      lVar2 = *(long *)(file + 0x28);
      ConstantNamePrefix(&local_258,*(string **)(lVar2 + lVar9));
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_258,**(ulong **)(lVar2 + lVar9));
      file = local_a8;
      local_238._0_8_ = local_238 + 0x10;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_238._16_8_ = *plVar5;
        local_238._24_8_ = puVar6[3];
      }
      else {
        local_238._16_8_ = *plVar5;
        local_238._0_8_ = (long *)*puVar6;
      }
      local_238._8_8_ = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      io::Printer::Print<char[5],std::__cxx11::string>
                (&local_198,"self::^name^ => \'^name^\',\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      lVar4 = lVar4 + 1;
      lVar9 = lVar9 + 0x20;
    } while (lVar4 < *(int *)(file + 4));
  }
  io::Printer::Outdent(&local_198);
  options_00 = local_58;
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"];\n");
  io::Printer::Print<>(&local_198,"\npublic static function name($value)\n{\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>(&local_198,"if (!isset(self::$valueToName[$value])) {\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>(&local_198,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>
            (&local_198,"\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"}\nreturn self::$valueToName[$value];\n");
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"}\n\n");
  io::Printer::Print<>(&local_198,"\npublic static function value($name)\n{\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>
            (&local_198,
             "$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>(&local_198,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Indent(&local_198);
  io::Printer::Print<>
            (&local_198,"\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"}\nreturn constant($const);\n");
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"}\n");
  io::Printer::Outdent(&local_198);
  io::Printer::Outdent(&local_198);
  io::Printer::Print<>(&local_198,"}\n\n");
  if (*(long *)((EnumDescriptor *)file + 0x18) != 0) {
    io::Printer::Print<>
              (&local_198,
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              ((string *)local_238,(EnumDescriptor *)file,options_00);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (&local_198,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               &local_80,(char (*) [4])"old",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              ((string *)local_238,(EnumDescriptor *)file,options_00);
    if ((ZeroCopyOutputStream *)local_238._8_8_ != (ZeroCopyOutputStream *)0x0) {
      pZVar7 = (ZeroCopyOutputStream *)0x0;
      do {
        if (*(char *)(local_238._0_8_ + (long)pZVar7) == '\\') {
          *(char *)(local_238._0_8_ + (long)pZVar7) = '/';
        }
        pZVar7 = (ZeroCopyOutputStream *)((long)&pZVar7->_vptr_ZeroCopyOutputStream + 1);
      } while (pZVar7 < (ulong)local_238._8_8_);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_238._0_8_,
               (pointer)(local_238._0_8_ + (long)(_func_int ***)local_238._8_8_));
    std::__cxx11::string::append((char *)&local_258);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
    pZVar7 = (ZeroCopyOutputStream *)(**(code **)(*(long *)local_b0 + 0x10))(local_b0,&local_258);
    io::Printer::Printer((Printer *)local_238,pZVar7,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)local_238,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_60);
    RootPhpNamespace<google::protobuf::EnumDescriptor>(&local_f8,(EnumDescriptor *)file,options_00);
    if (local_f8._M_string_length != 0) {
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)local_238,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,&local_f8);
    }
    FullClassName<google::protobuf::EnumDescriptor>(&local_50,(EnumDescriptor *)file,options_00);
    io::Printer::Print<>((Printer *)local_238,"if (false) {\n");
    io::Printer::Indent((Printer *)local_238);
    io::Printer::Indent((Printer *)local_238);
    io::Printer::Print<>((Printer *)local_238,"/**\n");
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_238," * This class is deprecated. Use ^new^ instead.\n",
               (char (*) [4])"new",&local_50);
    io::Printer::Print<>((Printer *)local_238," * @deprecated\n");
    io::Printer::Print<>((Printer *)local_238," */\n");
    LegacyGeneratedClassName<google::protobuf::EnumDescriptor>(&local_a0,(EnumDescriptor *)file);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_238,"class ^old^ {}\n",(char (*) [4])"old",&local_a0);
    paVar1 = &local_a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    io::Printer::Outdent((Printer *)local_238);
    io::Printer::Outdent((Printer *)local_238);
    io::Printer::Print<>((Printer *)local_238,"}\n");
    GeneratedClassNameImpl<google::protobuf::EnumDescriptor>(&local_a0,(EnumDescriptor *)file);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_238,"class_exists(^new^::class);\n",(char (*) [4])"new",&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              (&local_a0,(EnumDescriptor *)file,options_00);
    io::Printer::Print<char[4],std::__cxx11::string,char[9],std::__cxx11::string>
              ((Printer *)local_238,
               "@trigger_error(\'^old^ is deprecated and will be removed in the next major release. Use ^fullname^ instead\', E_USER_DEPRECATED);\n\n"
               ,(char (*) [4])"old",&local_a0,(char (*) [9])"fullname",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    io::Printer::~Printer((Printer *)local_238);
    if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  io::Printer::~Printer(&local_198);
  if (local_b8 != (ZeroCopyOutputStream *)0x0) {
    (*local_b8->_vptr_ZeroCopyOutputStream[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      const Options& options,
                      GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, options);

  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, options));
    LegacyGenerateClassFile(file, en, options, generator_context);
  }
}